

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeHalt(Vdbe *p)

{
  uint uVar1;
  sqlite3 *db;
  VdbeFrame *pVVar2;
  undefined3 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  VdbeFrame *pFrame;
  byte bVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  VdbeFrame *pDel;
  long lVar12;
  
  db = p->db;
  if (db->mallocFailed != '\0') {
    p->rc = 7;
  }
  if (p->aOnceFlag != (u8 *)0x0) {
    memset(p->aOnceFlag,0,(long)p->nOnceFlag);
  }
  pVVar2 = p->pFrame;
  if (p->pFrame != (VdbeFrame *)0x0) {
    do {
      pFrame = pVVar2;
      pVVar2 = pFrame->pParent;
    } while (pVVar2 != (VdbeFrame *)0x0);
    sqlite3VdbeFrameRestore(pFrame);
  }
  p->pFrame = (VdbeFrame *)0x0;
  p->nFrame = 0;
  if ((p->apCsr != (VdbeCursor **)0x0) && (0 < p->nCursor)) {
    lVar12 = 0;
    do {
      if (p->apCsr[lVar12] != (VdbeCursor *)0x0) {
        sqlite3VdbeFreeCursor(p,p->apCsr[lVar12]);
        p->apCsr[lVar12] = (VdbeCursor *)0x0;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < p->nCursor);
  }
  if (p->aMem != (Mem *)0x0) {
    releaseMemArray(p->aMem + 1,p->nMem);
  }
  while (pVVar2 = p->pDelFrame, pVVar2 != (VdbeFrame *)0x0) {
    p->pDelFrame = pVVar2->pParent;
    if (0 < pVVar2->nChildCsr) {
      iVar11 = pVVar2->nChildMem;
      lVar12 = 0;
      do {
        sqlite3VdbeFreeCursor(pVVar2->v,(VdbeCursor *)(&pVVar2[1].v)[(long)iVar11 * 7 + lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar2->nChildCsr);
    }
    releaseMemArray((Mem *)(pVVar2 + 1),pVVar2->nChildMem);
    sqlite3DbFree(pVVar2->v->db,pVVar2);
  }
  if (p->magic != 0xbdf20da3) {
    return 0;
  }
  if (p->pc < 0) goto LAB_00162427;
  sqlite3VdbeEnter(p);
  uVar1 = p->rc;
  bVar7 = (byte)uVar1;
  uVar10 = 0x2680 >> (bVar7 & 0x1f);
  uVar3 = (undefined3)(uVar10 >> 8);
  bVar9 = (byte)uVar10 & bVar7 < 0xe;
  iVar11 = CONCAT31(uVar3,bVar9);
  bVar4 = true;
  iVar8 = 0;
  if ((bVar9 == 1) &&
     (((uVar1 & 0xf) == 9 & (byte)((ushort)*(undefined2 *)&p->field_0x9a >> 8) & 1) == 0)) {
    if (((bVar7 == 0xd) || ((uVar1 & 0xff) == 7)) && ((char)*(undefined2 *)&p->field_0x9a < '\0')) {
      iVar8 = 2;
      bVar4 = false;
    }
    else {
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
      db->autoCommit = '\x01';
      iVar8 = 0;
    }
  }
  if ((p->rc == 0) && (0 < p->nFkConstraint)) {
    p->rc = 0x313;
    p->errorAction = '\x02';
    sqlite3SetString(&p->zErrMsg,p->db,"foreign key constraint failed");
  }
  if ((((db->nVTrans < 1) || (db->aVTrans != (VTable **)0x0)) && (db->autoCommit != '\0')) &&
     (db->writeVdbeCnt == (uint)((p->field_0x9b & 1) == 0))) {
    if ((p->rc != 0) &&
       (bVar9 = bVar9 | p->errorAction != '\x03', iVar11 = CONCAT31(uVar3,bVar9), bVar9 != 0)) {
LAB_00162365:
      sqlite3RollbackAll(db,0);
LAB_00162381:
      db->nStatement = 0;
      goto LAB_0016238c;
    }
    if (p->db->nDeferredCons < 1) {
      iVar5 = vdbeCommit(db,p);
      iVar6 = iVar11;
LAB_00162345:
      iVar11 = iVar6;
      if (iVar5 == 0) {
        db->nDeferredCons = 0;
        *(byte *)&db->flags = (byte)db->flags & 0xfd;
        goto LAB_00162381;
      }
      if ((iVar5 != 5) || ((p->field_0x9b & 1) == 0)) {
        p->rc = iVar5;
        goto LAB_00162365;
      }
      iVar11 = 5;
      bVar4 = false;
    }
    else {
      p->rc = 0x313;
      p->errorAction = '\x02';
      bVar4 = false;
      sqlite3SetString(&p->zErrMsg,p->db,"foreign key constraint failed");
      iVar11 = 1;
      iVar5 = 0x313;
      iVar6 = 1;
      if ((p->field_0x9b & 1) == 0) goto LAB_00162345;
    }
  }
  else {
    if (((bVar4) && (iVar8 = 1, p->rc != 0)) && (p->errorAction != '\x03')) {
      if (p->errorAction == '\x02') {
        iVar8 = 2;
      }
      else {
        sqlite3RollbackAll(db,0x204);
        sqlite3CloseSavepoints(db);
        db->autoCommit = '\x01';
        iVar8 = 0;
      }
    }
LAB_0016238c:
    if ((iVar8 != 0) && (iVar6 = sqlite3VdbeCloseStatement(p,iVar8), iVar6 != 0)) {
      if (p->rc == 0 || (char)p->rc == '\x13') {
        p->rc = iVar6;
        sqlite3DbFree(db,p->zErrMsg);
        p->zErrMsg = (char *)0x0;
      }
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
      db->autoCommit = '\x01';
    }
    bVar4 = true;
    if ((p->field_0x9a & 0x10) != 0) {
      if (iVar8 == 2) {
        db->nChange = 0;
      }
      else {
        iVar8 = p->nChange;
        db->nChange = iVar8;
        db->nTotalChange = db->nTotalChange + iVar8;
      }
      p->nChange = 0;
    }
  }
  sqlite3VdbeLeave(p);
  if (!bVar4) {
    return iVar11;
  }
LAB_00162427:
  if ((-1 < p->pc) && (db->activeVdbeCnt = db->activeVdbeCnt + -1, (p->field_0x9b & 1) == 0)) {
    db->writeVdbeCnt = db->writeVdbeCnt + -1;
  }
  p->magic = 0x519c2973;
  if (p->db->mallocFailed != '\0') {
    p->rc = 7;
  }
  return (uint)(p->rc == 5) * 5;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeHalt(Vdbe *p){
  int rc;                         /* Used to store transient return codes */
  sqlite3 *db = p->db;

  /* This function contains the logic that determines if a statement or
  ** transaction will be committed or rolled back as a result of the
  ** execution of this virtual machine. 
  **
  ** If any of the following errors occur:
  **
  **     SQLITE_NOMEM
  **     SQLITE_IOERR
  **     SQLITE_FULL
  **     SQLITE_INTERRUPT
  **
  ** Then the internal cache might have been left in an inconsistent
  ** state.  We need to rollback the statement transaction, if there is
  ** one, or the complete transaction if there is no statement transaction.
  */

  if( p->db->mallocFailed ){
    p->rc = SQLITE_NOMEM;
  }
  if( p->aOnceFlag ) memset(p->aOnceFlag, 0, p->nOnceFlag);
  closeAllCursors(p);
  if( p->magic!=VDBE_MAGIC_RUN ){
    return SQLITE_OK;
  }
  checkActiveVdbeCnt(db);

  /* No commit or rollback needed if the program never started */
  if( p->pc>=0 ){
    int mrc;   /* Primary error code from p->rc */
    int eStatementOp = 0;
    int isSpecialError;            /* Set to true if a 'special' error */

    /* Lock all btrees used by the statement */
    sqlite3VdbeEnter(p);

    /* Check for one of the special errors */
    mrc = p->rc & 0xff;
    assert( p->rc!=SQLITE_IOERR_BLOCKED );  /* This error no longer exists */
    isSpecialError = mrc==SQLITE_NOMEM || mrc==SQLITE_IOERR
                     || mrc==SQLITE_INTERRUPT || mrc==SQLITE_FULL;
    if( isSpecialError ){
      /* If the query was read-only and the error code is SQLITE_INTERRUPT, 
      ** no rollback is necessary. Otherwise, at least a savepoint 
      ** transaction must be rolled back to restore the database to a 
      ** consistent state.
      **
      ** Even if the statement is read-only, it is important to perform
      ** a statement or transaction rollback operation. If the error 
      ** occurred while writing to the journal, sub-journal or database
      ** file as part of an effort to free up cache space (see function
      ** pagerStress() in pager.c), the rollback is required to restore 
      ** the pager to a consistent state.
      */
      if( !p->readOnly || mrc!=SQLITE_INTERRUPT ){
        if( (mrc==SQLITE_NOMEM || mrc==SQLITE_FULL) && p->usesStmtJournal ){
          eStatementOp = SAVEPOINT_ROLLBACK;
        }else{
          /* We are forced to roll back the active transaction. Before doing
          ** so, abort any other statements this handle currently has active.
          */
          sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
          sqlite3CloseSavepoints(db);
          db->autoCommit = 1;
        }
      }
    }

    /* Check for immediate foreign key violations. */
    if( p->rc==SQLITE_OK ){
      sqlite3VdbeCheckFk(p, 0);
    }
  
    /* If the auto-commit flag is set and this is the only active writer 
    ** VM, then we do either a commit or rollback of the current transaction. 
    **
    ** Note: This block also runs if one of the special errors handled 
    ** above has occurred. 
    */
    if( !sqlite3VtabInSync(db) 
     && db->autoCommit 
     && db->writeVdbeCnt==(p->readOnly==0) 
    ){
      if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
        rc = sqlite3VdbeCheckFk(p, 1);
        if( rc!=SQLITE_OK ){
          if( NEVER(p->readOnly) ){
            sqlite3VdbeLeave(p);
            return SQLITE_ERROR;
          }
          rc = SQLITE_CONSTRAINT_FOREIGNKEY;
        }else{ 
          /* The auto-commit flag is true, the vdbe program was successful 
          ** or hit an 'OR FAIL' constraint and there are no deferred foreign
          ** key constraints to hold up the transaction. This means a commit 
          ** is required. */
          rc = vdbeCommit(db, p);
        }
        if( rc==SQLITE_BUSY && p->readOnly ){
          sqlite3VdbeLeave(p);
          return SQLITE_BUSY;
        }else if( rc!=SQLITE_OK ){
          p->rc = rc;
          sqlite3RollbackAll(db, SQLITE_OK);
        }else{
          db->nDeferredCons = 0;
          sqlite3CommitInternalChanges(db);
        }
      }else{
        sqlite3RollbackAll(db, SQLITE_OK);
      }
      db->nStatement = 0;
    }else if( eStatementOp==0 ){
      if( p->rc==SQLITE_OK || p->errorAction==OE_Fail ){
        eStatementOp = SAVEPOINT_RELEASE;
      }else if( p->errorAction==OE_Abort ){
        eStatementOp = SAVEPOINT_ROLLBACK;
      }else{
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
      }
    }
  
    /* If eStatementOp is non-zero, then a statement transaction needs to
    ** be committed or rolled back. Call sqlite3VdbeCloseStatement() to
    ** do so. If this operation returns an error, and the current statement
    ** error code is SQLITE_OK or SQLITE_CONSTRAINT, then promote the
    ** current statement error code.
    */
    if( eStatementOp ){
      rc = sqlite3VdbeCloseStatement(p, eStatementOp);
      if( rc ){
        if( p->rc==SQLITE_OK || (p->rc&0xff)==SQLITE_CONSTRAINT ){
          p->rc = rc;
          sqlite3DbFree(db, p->zErrMsg);
          p->zErrMsg = 0;
        }
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
      }
    }
  
    /* If this was an INSERT, UPDATE or DELETE and no statement transaction
    ** has been rolled back, update the database connection change-counter. 
    */
    if( p->changeCntOn ){
      if( eStatementOp!=SAVEPOINT_ROLLBACK ){
        sqlite3VdbeSetChanges(db, p->nChange);
      }else{
        sqlite3VdbeSetChanges(db, 0);
      }
      p->nChange = 0;
    }

    /* Release the locks */
    sqlite3VdbeLeave(p);
  }

  /* We have successfully halted and closed the VM.  Record this fact. */
  if( p->pc>=0 ){
    db->activeVdbeCnt--;
    if( !p->readOnly ){
      db->writeVdbeCnt--;
    }
    assert( db->activeVdbeCnt>=db->writeVdbeCnt );
  }
  p->magic = VDBE_MAGIC_HALT;
  checkActiveVdbeCnt(db);
  if( p->db->mallocFailed ){
    p->rc = SQLITE_NOMEM;
  }

  /* If the auto-commit flag is set to true, then any locks that were held
  ** by connection db have now been released. Call sqlite3ConnectionUnlocked() 
  ** to invoke any required unlock-notify callbacks.
  */
  if( db->autoCommit ){
    sqlite3ConnectionUnlocked(db);
  }

  assert( db->activeVdbeCnt>0 || db->autoCommit==0 || db->nStatement==0 );
  return (p->rc==SQLITE_BUSY ? SQLITE_BUSY : SQLITE_OK);
}